

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error.h
# Opt level: O0

UnsupportedError * mp::MakeUnsupportedError(CStringRef format_str,ArgList args)

{
  UnsupportedError *in_RDI;
  undefined1 in_stack_000001d8 [16];
  CStringRef in_stack_000001e8;
  string local_48 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffc0;
  UnsupportedError *in_stack_ffffffffffffffc8;
  CStringRef in_stack_ffffffffffffffd0;
  BasicCStringRef<char> local_28 [5];
  
  fmt::BasicCStringRef<char>::BasicCStringRef(local_28,"unsupported: {}");
  fmt::format_abi_cxx11_(in_stack_000001e8,(ArgList)in_stack_000001d8);
  UnsupportedError::UnsupportedError<std::__cxx11::string>
            (in_stack_ffffffffffffffc8,in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc0);
  std::__cxx11::string::~string(local_48);
  return in_RDI;
}

Assistant:

inline UnsupportedError MakeUnsupportedError(
    fmt::CStringRef format_str, fmt::ArgList args) {
  return UnsupportedError("unsupported: {}", fmt::format(format_str, args));
}